

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadCrashHdl.cpp
# Opt level: O2

void __thiscall ThreadSettings::~ThreadSettings(ThreadSettings *this)

{
  if ((__locale_t)this->prevLocale != (__locale_t)0x0) {
    uselocale((__locale_t)this->prevLocale);
  }
  if ((__locale_t)this->threadLocale != (__locale_t)0x0) {
    freelocale((__locale_t)this->threadLocale);
    this->threadLocale = (locale_t)0x0;
  }
  CrashHandlerUnregisterThread();
  return;
}

Assistant:

ThreadSettings::~ThreadSettings()
{
#if IBM
    _configthreadlocale(_DISABLE_PER_THREAD_LOCALE);
#else
    if (prevLocale)
        uselocale(prevLocale);
    if (threadLocale) {
        freelocale(threadLocale);
        threadLocale = locale_t(0);
    }
#endif
    CrashHandlerUnregisterThread();
}